

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExponentiallyDecayingReservoir.cc
# Opt level: O0

void __thiscall
cppmetrics::ExponentiallyDecayingReservoir::rescale
          (ExponentiallyDecayingReservoir *this,time_t now,time_t next)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  size_type sVar4;
  reference __x;
  pointer ppVar5;
  mapped_type *this_00;
  double local_138;
  WeightedSample local_130;
  _Base_ptr local_120;
  _Base_ptr local_118;
  double local_110;
  double new_weight;
  long value;
  _Self local_f8;
  iterator it;
  double *key;
  iterator __end2_1;
  iterator __begin2_1;
  unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>
  *__range2_1;
  pair<const_double,_cppmetrics::WeightedSample> *pair;
  iterator __end2;
  iterator __begin2;
  map<double,_cppmetrics::WeightedSample,_std::less<double>,_std::allocator<std::pair<const_double,_cppmetrics::WeightedSample>_>_>
  *__range2;
  unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_> keys;
  double scaling_factor;
  time_t old_start_time;
  lock_guard<std::mutex> lock;
  time_t next_local;
  time_t now_local;
  ExponentiallyDecayingReservoir *this_local;
  memory_order __b;
  
  lock._M_device = (mutex_type *)next;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&old_start_time,&this->m_mutex);
  this->m_next_rescale_time = now + 0x3c;
  lVar1 = this->m_start;
  iVar3 = (*this->m_clock->_vptr_Clock[1])();
  this->m_start = CONCAT44(extraout_var,iVar3);
  keys._M_h._M_single_bucket =
       (__node_base_ptr)exp(-this->m_alpha * (double)(this->m_start - lVar1));
  bVar2 = anon_unknown_0::HasEquivalentOrder((double)keys._M_h._M_single_bucket,0.0);
  if (bVar2) {
    std::
    map<double,_cppmetrics::WeightedSample,_std::less<double>,_std::allocator<std::pair<const_double,_cppmetrics::WeightedSample>_>_>
    ::clear(&this->m_samples);
  }
  else {
    std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>::
    unordered_set((unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>
                   *)&__range2);
    sVar4 = std::
            map<double,_cppmetrics::WeightedSample,_std::less<double>,_std::allocator<std::pair<const_double,_cppmetrics::WeightedSample>_>_>
            ::size(&this->m_samples);
    std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>::
    reserve((unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>
             *)&__range2,sVar4);
    __end2 = std::
             map<double,_cppmetrics::WeightedSample,_std::less<double>,_std::allocator<std::pair<const_double,_cppmetrics::WeightedSample>_>_>
             ::begin(&this->m_samples);
    pair = (pair<const_double,_cppmetrics::WeightedSample> *)
           std::
           map<double,_cppmetrics::WeightedSample,_std::less<double>,_std::allocator<std::pair<const_double,_cppmetrics::WeightedSample>_>_>
           ::end(&this->m_samples);
    while (bVar2 = std::operator!=(&__end2,(_Self *)&pair), bVar2) {
      __x = std::_Rb_tree_iterator<std::pair<const_double,_cppmetrics::WeightedSample>_>::operator*
                      (&__end2);
      std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>
      ::insert((unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>
                *)&__range2,&__x->first);
      std::_Rb_tree_iterator<std::pair<const_double,_cppmetrics::WeightedSample>_>::operator++
                (&__end2);
    }
    __end2_1 = std::
               unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>
               ::begin((unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>
                        *)&__range2);
    key = (double *)
          std::
          unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>::
          end((unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>
               *)&__range2);
    while (bVar2 = std::__detail::operator!=
                             (&__end2_1.super__Node_iterator_base<double,_false>,
                              (_Node_iterator_base<double,_false> *)&key), bVar2) {
      it._M_node = (_Base_ptr)
                   std::__detail::_Node_iterator<double,_true,_false>::operator*(&__end2_1);
      local_f8._M_node =
           (_Base_ptr)
           std::
           map<double,_cppmetrics::WeightedSample,_std::less<double>,_std::allocator<std::pair<const_double,_cppmetrics::WeightedSample>_>_>
           ::find(&this->m_samples,(key_type *)it._M_node);
      value = (long)std::
                    map<double,_cppmetrics::WeightedSample,_std::less<double>,_std::allocator<std::pair<const_double,_cppmetrics::WeightedSample>_>_>
                    ::end(&this->m_samples);
      bVar2 = std::operator!=(&local_f8,(_Self *)&value);
      if (!bVar2) {
        __assert_fail("it != m_samples.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/benjamin-bader[P]cppmetrics/metrics/src/ExponentiallyDecayingReservoir.cc"
                      ,0xc0,
                      "void cppmetrics::ExponentiallyDecayingReservoir::rescale(std::time_t, std::time_t)"
                     );
      }
      ppVar5 = std::_Rb_tree_iterator<std::pair<const_double,_cppmetrics::WeightedSample>_>::
               operator->(&local_f8);
      new_weight = (double)WeightedSample::get_value(&ppVar5->second);
      ppVar5 = std::_Rb_tree_iterator<std::pair<const_double,_cppmetrics::WeightedSample>_>::
               operator->(&local_f8);
      local_110 = WeightedSample::get_weight(&ppVar5->second);
      local_110 = local_110 * (double)keys._M_h._M_single_bucket;
      local_118 = local_f8._M_node;
      local_120 = (_Base_ptr)
                  std::
                  map<double,cppmetrics::WeightedSample,std::less<double>,std::allocator<std::pair<double_const,cppmetrics::WeightedSample>>>
                  ::erase_abi_cxx11_((map<double,cppmetrics::WeightedSample,std::less<double>,std::allocator<std::pair<double_const,cppmetrics::WeightedSample>>>
                                      *)&this->m_samples,local_f8._M_node);
      bVar2 = anon_unknown_0::HasEquivalentOrder(local_110,0.0);
      if (!bVar2) {
        WeightedSample::WeightedSample(&local_130,(long)new_weight,local_110);
        local_138 = *(double *)it._M_node * (double)keys._M_h._M_single_bucket;
        this_00 = std::
                  map<double,_cppmetrics::WeightedSample,_std::less<double>,_std::allocator<std::pair<const_double,_cppmetrics::WeightedSample>_>_>
                  ::operator[](&this->m_samples,&local_138);
        WeightedSample::operator=(this_00,&local_130);
      }
      std::__detail::_Node_iterator<double,_true,_false>::operator++(&__end2_1);
    }
    std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>::
    ~unordered_set((unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>
                    *)&__range2);
  }
  sVar4 = std::
          map<double,_cppmetrics::WeightedSample,_std::less<double>,_std::allocator<std::pair<const_double,_cppmetrics::WeightedSample>_>_>
          ::size(&this->m_samples);
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  LOCK();
  (this->m_count).super___atomic_base<long>._M_i = sVar4;
  UNLOCK();
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&old_start_time);
  return;
}

Assistant:

void ExponentiallyDecayingReservoir::rescale(std::time_t now, std::time_t next)
{
  std::lock_guard<std::mutex> lock(m_mutex);

  m_next_rescale_time = now + kRescalePeriod;
  const auto old_start_time = m_start;
  m_start = m_clock->now_as_time_t();

  const double scaling_factor = exp(-m_alpha * (m_start - old_start_time));
  if (HasEquivalentOrder(scaling_factor, 0.0))
  {
    m_samples.clear();
  }
  else
  {
    std::unordered_set<double> keys;
    keys.reserve(m_samples.size());
    for (auto&& pair : m_samples)
    {
      keys.insert(pair.first);
    }

    for (auto&& key : keys)
    {
      auto it = m_samples.find(key);
      assert(it != m_samples.end());
      auto value = it->second.get_value();
      auto new_weight = it->second.get_weight() * scaling_factor;
      m_samples.erase(it);

      if (!HasEquivalentOrder(new_weight, 0))
      {
        m_samples[key * scaling_factor] = {value, new_weight};
      }
    }
  }

  m_count.store(m_samples.size());
}